

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O2

void __thiscall
LinkedListPool<depspawn::internal::Workitem,_true,_false>::~LinkedListPool
          (LinkedListPool<depspawn::internal::Workitem,_true,_false> *this)

{
  pointer ppWVar1;
  pointer ppWVar2;
  
  ppWVar1 = (this->v_).
            super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppWVar2 = (this->v_).
                 super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppWVar2 != ppWVar1;
      ppWVar2 = ppWVar2 + 1) {
    free(*ppWVar2);
  }
  std::_Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
  ::~_Vector_base((_Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
                   *)this);
  return;
}

Assistant:

~LinkedListPool()
  {
    typename vector_t::const_iterator const itend = v_.end();
    for(typename vector_t::const_iterator it = v_.begin(); it != itend; ++it)
      PoolAllocator_malloc_free<SCALABLE>::free(reinterpret_cast<char*>(*it));
  }